

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void ws_handshake(mg_connection *nc,mg_str *key)

{
  size_t sVar1;
  char sha [20];
  char b64_sha [40];
  char buf [100];
  uchar auStack_138 [32];
  char local_118 [48];
  cs_sha1_ctx local_e8;
  uchar local_88 [112];
  
  snprintf((char *)local_88,100,"%.*s%s");
  local_e8.state[0] = 0x67452301;
  local_e8.state[1] = 0xefcdab89;
  local_e8.state[2] = 0x98badcfe;
  local_e8.state[3] = 0x10325476;
  local_e8.state[4] = 0xc3d2e1f0;
  local_e8.count[0] = 0;
  local_e8.count[1] = 0;
  sVar1 = strlen((char *)local_88);
  cs_sha1_update(&local_e8,local_88,(uint32_t)sVar1);
  cs_sha1_final(auStack_138,&local_e8);
  cs_base64_encode(auStack_138,0x14,local_118);
  mg_printf(nc,"%s%s%s",
            "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
            ,local_118,"\r\n\r\n");
  return;
}

Assistant:

static void ws_handshake(struct mg_connection *nc, const struct mg_str *key) {
    static const char *magic = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    char buf[MG_VPRINTF_BUFFER_SIZE], sha[20], b64_sha[sizeof(sha) * 2];
    cs_sha1_ctx sha_ctx;

    snprintf(buf, sizeof(buf), "%.*s%s", (int) key->len, key->p, magic);

    cs_sha1_init(&sha_ctx);
    cs_sha1_update(&sha_ctx, (unsigned char *) buf, strlen(buf));
    cs_sha1_final((unsigned char *) sha, &sha_ctx);

    mg_base64_encode((unsigned char *) sha, sizeof(sha), b64_sha);
    mg_printf(nc, "%s%s%s",
              "HTTP/1.1 101 Switching Protocols\r\n"
                      "Upgrade: websocket\r\n"
                      "Connection: Upgrade\r\n"
                      "Sec-WebSocket-Accept: ",
              b64_sha, "\r\n\r\n");
}